

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O2

void __thiscall
disruptor::test::SequenceBarrierFixture::~SequenceBarrierFixture(SequenceBarrierFixture *this)

{
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&(this->barrier).dependents_.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>);
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&(this->dependents).
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>);
  return;
}

Assistant:

SequenceBarrierFixture() : barrier(wait_strategy, cursor, dependents) {}